

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O2

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateReduceLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  string *this_00;
  uint32 uVar1;
  bool bVar2;
  Type *pTVar3;
  ReduceLayerParams *pRVar4;
  Result *_result;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  string err;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  string local_48;
  
  validateInputCount(__return_storage_ptr__,layer,1,1);
  bVar2 = Result::good(__return_storage_ptr__);
  if (!bVar2) {
    return __return_storage_ptr__;
  }
  this_00 = &__return_storage_ptr__->m_message;
  std::__cxx11::string::~string((string *)this_00);
  validateOutputCount(__return_storage_ptr__,layer,1,1);
  bVar2 = Result::good(__return_storage_ptr__);
  if (!bVar2) {
    return __return_storage_ptr__;
  }
  std::__cxx11::string::~string((string *)this_00);
  if ((this->ndArrayInterpretation != true) ||
     ((layer->inputtensor_).super_RepeatedPtrFieldBase.current_size_ < 1)) goto LAB_0027b3ec;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"Reduce",(allocator<char> *)&err);
  validateInputOutputRankEquality(__return_storage_ptr__,layer,&local_48,&this->blobNameToRank);
  std::__cxx11::string::~string((string *)&local_48);
  bVar2 = Result::good(__return_storage_ptr__);
  if (!bVar2) {
    return __return_storage_ptr__;
  }
  std::__cxx11::string::~string((string *)this_00);
  pTVar3 = google::protobuf::internal::RepeatedPtrFieldBase::
           Get<google::protobuf::RepeatedPtrField<CoreML::Specification::Tensor>::TypeHandler>
                     (&(layer->inputtensor_).super_RepeatedPtrFieldBase,0);
  uVar1 = pTVar3->rank_;
  err._M_dataplus._M_p = (pointer)&err.field_2;
  err._M_string_length = 0;
  err.field_2._M_local_buf[0] = '\0';
  pRVar4 = Specification::NeuralNetworkLayer::reduce(layer);
  switch(pRVar4->axis_) {
  case 0:
    if ((int)uVar1 < 3) {
LAB_0027b35b:
      std::__cxx11::string::string((string *)&bStack_c8,(string *)(layer->name_).ptr_);
      std::operator+(&local_a8,"Reduce layer \'",&bStack_c8);
      std::operator+(&local_68,&local_a8,
                     "\': input\'s rank is smaller than the dimensions provided in the axis parameter"
                    );
LAB_0027b391:
      std::__cxx11::string::operator=((string *)&err,(string *)&local_68);
      std::__cxx11::string::~string((string *)&local_68);
      std::__cxx11::string::~string((string *)&local_a8);
      std::__cxx11::string::~string((string *)&bStack_c8);
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&err);
      std::__cxx11::string::~string((string *)&err);
      return __return_storage_ptr__;
    }
    break;
  case 1:
    if ((int)uVar1 < 2) goto LAB_0027b35b;
    break;
  case 2:
  case 3:
  case 4:
    if ((int)uVar1 < 1) goto LAB_0027b35b;
    break;
  default:
    if (pRVar4->axis_ == 0x7fffffff) {
      std::__cxx11::string::string((string *)&bStack_c8,(string *)(layer->name_).ptr_);
      std::operator+(&local_a8,"Reduce layer: \'",&bStack_c8);
      std::operator+(&local_68,&local_a8,"\': unknown value for parameter \'axis\'.");
      goto LAB_0027b391;
    }
  }
  std::__cxx11::string::~string((string *)&err);
LAB_0027b3ec:
  Result::Result(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateReduceLayer(const Specification::NeuralNetworkLayer& layer) {
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputCount(layer, 1, 1));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateOutputCount(layer, 1, 1));

    if (ndArrayInterpretation && layer.inputtensor_size() > 0) {
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputOutputRankEquality(layer, "Reduce", blobNameToRank));

        int rank = static_cast<int>(layer.inputtensor(0).rank());
        bool sufficientInputRank = true;
        std::string err;

        switch (layer.reduce().axis()) {
            case Specification::ReduceLayerParams::CHW:
                if (rank < 3) {sufficientInputRank = false;}
                break;
            case Specification::ReduceLayerParams::HW:
                if (rank < 2) {sufficientInputRank = false;}
                break;
            case Specification::ReduceLayerParams::H:
                if (rank < 1) {sufficientInputRank = false;}
                break;
            case Specification::ReduceLayerParams::W:
                if (rank < 1) {sufficientInputRank = false;}
                break;
            case Specification::ReduceLayerParams::C:
                if (rank < 1) {sufficientInputRank = false;}
                break;
            case CoreML::Specification::ReduceLayerParams_ReduceAxis_ReduceLayerParams_ReduceAxis_INT_MIN_SENTINEL_DO_NOT_USE_:
            case CoreML::Specification::ReduceLayerParams_ReduceAxis_ReduceLayerParams_ReduceAxis_INT_MAX_SENTINEL_DO_NOT_USE_:
                err = "Reduce layer: '" + std::string(layer.name()) + "': unknown value for parameter 'axis'.";
                return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }
        if (!sufficientInputRank) {
            err = "Reduce layer '" + std::string(layer.name()) + "': input's rank is smaller than the dimensions provided in the axis parameter";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }
    }
    return Result();
}